

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

ui_event inkey_m(void)

{
  undefined4 in_EDX;
  bool bVar1;
  ui_event uVar2;
  ui_event uVar3;
  undefined8 local_30;
  ui_event_type local_28;
  mouseclick local_14;
  ui_event ke;
  
  uVar2._8_4_ = in_EDX;
  uVar2.mouse = (mouseclick)local_30;
  local_14.type = EVT_NONE;
  local_14.x = '\0';
  local_14.y = '\0';
  local_14.button = '\0';
  local_14.mods = '\0';
  ke.type = EVT_NONE;
  while( true ) {
    bVar1 = false;
    if (((local_14.type != EVT_ESCAPE) && (bVar1 = false, local_14.type != EVT_KBRD)) &&
       (bVar1 = false, local_14.type != EVT_MOUSE)) {
      bVar1 = local_14.type != EVT_BUTTON;
    }
    if (!bVar1) break;
    uVar2 = inkey_ex();
    local_14 = uVar2.mouse;
    local_28 = (ui_event_type)uVar2.key.mods;
    ke.type = local_28;
  }
  if (local_14.type == EVT_ESCAPE) {
    local_14.type = EVT_KBRD;
    local_14.x = '\0';
    local_14.y = 0xe0;
    local_14.button = '\0';
    local_14.mods = '\0';
    ke.type._0_1_ = 0;
  }
  else if (local_14.type == EVT_BUTTON) {
    local_14.type = EVT_KBRD;
  }
  uVar3._9_3_ = uVar2._9_3_;
  uVar3.key.mods = ke.type._0_1_;
  uVar3.mouse = local_14;
  return uVar3;
}

Assistant:

ui_event inkey_m(void)
{
	ui_event ke = EVENT_EMPTY;

	/* Only accept a keypress */
	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD	&&
		   ke.type != EVT_MOUSE  && ke.type != EVT_BUTTON)
		ke = inkey_ex();
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

  return ke;
}